

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  _Base_ptr p_Var4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  _Base_ptr in_RCX;
  size_t start_memory;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  EasyUseMap<HashObject<16,_16>,_int> set;
  key_type local_70;
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  uVar10 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    uVar9 = 1;
    lVar6 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      in_RCX = (_Base_ptr)0x101010101010101;
      local_70.buffer_._0_8_ = (uVar10 & 0xff) * 0x101010101010101;
      local_70.buffer_._8_4_ = SUB84(local_70.buffer_._0_8_,0);
      local_70.i_ = (int)uVar10;
      puVar5 = (uint *)std::
                       map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                       ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                     *)&local_60,&local_70);
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      *puVar5 = uVar9;
    } while (iters != uVar9);
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar6 = std::chrono::_V2::steady_clock::now();
    if (iters < 1) {
      uVar9 = 1;
    }
    else {
      uVar9 = 1;
      uVar10 = 0;
      do {
        p_Var8 = p_Var1;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar10];
          p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var1->_M_header;
          do {
            p_Var12 = (_Rb_tree_header *)p_Var13;
            p_Var11 = p_Var4;
            iVar3 = (int)*(size_t *)(p_Var11 + 1);
            p_Var13 = p_Var11;
            if (iVar3 < iVar2) {
              p_Var13 = &p_Var12->_M_header;
            }
            p_Var4 = (&p_Var11->_M_left)[iVar3 < iVar2];
          } while ((&p_Var11->_M_left)[iVar3 < iVar2] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var13 != p_Var1) {
            if (iVar3 < iVar2) {
              p_Var11 = &p_Var12->_M_header;
            }
            p_Var8 = (_Rb_tree_header *)p_Var13;
            if (iVar2 < (int)((_Rb_tree_header *)p_Var11)->_M_node_count) {
              p_Var8 = p_Var1;
            }
          }
        }
        uVar9 = uVar9 ^ p_Var8 != p_Var1;
        uVar10 = uVar10 + 1;
        in_RCX = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      } while (uVar10 != (uint)iters);
    }
  }
  lVar7 = std::chrono::_V2::steady_clock::now();
  srand(uVar9);
  report(title,(double)(lVar7 - lVar6),iters,start_memory,(size_t)in_RCX);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}